

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

int is_noise_model_different(aom_noise_model_t *noise_model)

{
  undefined4 uVar1;
  int iVar2;
  long in_RDI;
  double dVar3;
  int i;
  double weight;
  int j;
  double total_weight;
  double diff;
  aom_equation_system_t *combined_eqns;
  aom_equation_system_t *latest_eqns;
  double dx;
  double corr;
  int c;
  double kStrengthThreshold;
  double kCoeffThreshold;
  int local_6c;
  double local_68;
  int local_5c;
  double local_58;
  double in_stack_ffffffffffffffb0;
  double *in_stack_ffffffffffffffb8;
  double *in_stack_ffffffffffffffc0;
  int local_24;
  
  uVar1 = *(undefined4 *)(in_RDI + 8);
  local_24 = 0;
  while( true ) {
    if (0 < local_24) {
      return 0;
    }
    dVar3 = aom_normalized_cross_correlation
                      (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                       (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    if (dVar3 < 0.9) break;
    iVar2 = *(int *)(in_RDI + (long)local_24 * 0x70 + 0x1b0);
    in_stack_ffffffffffffffc0 = (double *)(in_RDI + (long)local_24 * 0x70 + 0x180);
    in_stack_ffffffffffffffb8 = (double *)(in_RDI + (long)local_24 * 0x70 + 0x30);
    in_stack_ffffffffffffffb0 = 0.0;
    local_58 = 0.0;
    for (local_5c = 0; local_5c < *(int *)(in_stack_ffffffffffffffc0 + 3); local_5c = local_5c + 1)
    {
      local_68 = 0.0;
      for (local_6c = 0; local_6c < *(int *)(in_stack_ffffffffffffffc0 + 3); local_6c = local_6c + 1
          ) {
        local_68 = *(double *)
                    ((long)*in_stack_ffffffffffffffc0 +
                    (long)(local_6c * *(int *)(in_stack_ffffffffffffffc0 + 3) + local_5c) * 8) +
                   local_68;
      }
      dVar3 = sqrt(local_68);
      in_stack_ffffffffffffffb0 =
           dVar3 * ABS(*(double *)((long)in_stack_ffffffffffffffc0[2] + (long)local_5c * 8) -
                       *(double *)((long)in_stack_ffffffffffffffb8[2] + (long)local_5c * 8)) +
           in_stack_ffffffffffffffb0;
      local_58 = dVar3 + local_58;
    }
    if ((double)(1 << ((char)uVar1 - 8U & 0x1f)) * 0.005 <
        (in_stack_ffffffffffffffb0 * (1.0 / (double)iVar2)) / local_58) {
      return 1;
    }
    local_24 = local_24 + 1;
  }
  return 1;
}

Assistant:

static int is_noise_model_different(aom_noise_model_t *const noise_model) {
  // These thresholds are kind of arbitrary and will likely need further tuning
  // (or exported as parameters). The threshold on noise strength is a weighted
  // difference between the noise strength histograms
  const double kCoeffThreshold = 0.9;
  const double kStrengthThreshold =
      0.005 * (1 << (noise_model->params.bit_depth - 8));
  for (int c = 0; c < 1; ++c) {
    const double corr =
        aom_normalized_cross_correlation(noise_model->latest_state[c].eqns.x,
                                         noise_model->combined_state[c].eqns.x,
                                         noise_model->combined_state[c].eqns.n);
    if (corr < kCoeffThreshold) return 1;

    const double dx =
        1.0 / noise_model->latest_state[c].strength_solver.num_bins;

    const aom_equation_system_t *latest_eqns =
        &noise_model->latest_state[c].strength_solver.eqns;
    const aom_equation_system_t *combined_eqns =
        &noise_model->combined_state[c].strength_solver.eqns;
    double diff = 0;
    double total_weight = 0;
    for (int j = 0; j < latest_eqns->n; ++j) {
      double weight = 0;
      for (int i = 0; i < latest_eqns->n; ++i) {
        weight += latest_eqns->A[i * latest_eqns->n + j];
      }
      weight = sqrt(weight);
      diff += weight * fabs(latest_eqns->x[j] - combined_eqns->x[j]);
      total_weight += weight;
    }
    if (diff * dx / total_weight > kStrengthThreshold) return 1;
  }
  return 0;
}